

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# todec_test.cpp
# Opt level: O0

void test_single<unsigned_long_long>(void)

{
  bool bVar1;
  __type _Var2;
  ostream *poVar3;
  unsigned_long_long uVar4;
  runtime_error *this;
  ostringstream oss;
  ostringstream b;
  ostringstream a;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff848;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff850;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff868;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff870;
  string local_5e8 [32];
  string local_5c8 [39];
  undefined1 local_5a1;
  string local_5a0 [32];
  ostringstream local_580 [376];
  string local_408 [32];
  string local_3e8 [32];
  string local_3c8 [32];
  string local_3a8 [32];
  string local_388 [32];
  string local_368 [32];
  unsigned_long_long local_348;
  unsigned_long_long local_340;
  unsigned_long_long local_338;
  unsigned_long_long local_330;
  unsigned_long_long local_328;
  unsigned_long_long local_320;
  unsigned_long_long local_318;
  unsigned_long_long local_310;
  unsigned_long_long local_308;
  ostringstream local_2f0 [376];
  ostringstream local_178 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_178);
  std::__cxx11::ostringstream::ostringstream(local_2f0);
  std::numeric_limits<unsigned_long_long>::min();
  local_308 = (unsigned_long_long)
              cppcms::impl::cint<unsigned_long_long>((unsigned_long_long)in_stack_fffffffffffff848);
  poVar3 = cppcms::impl::details::operator<<
                     ((ostream *)in_stack_fffffffffffff850,
                      (write_int_to_stream<unsigned_long_long> *)in_stack_fffffffffffff848);
  std::operator<<(poVar3," ");
  std::numeric_limits<unsigned_long_long>::max();
  local_310 = (unsigned_long_long)
              cppcms::impl::cint<unsigned_long_long>((unsigned_long_long)in_stack_fffffffffffff848);
  poVar3 = cppcms::impl::details::operator<<
                     ((ostream *)in_stack_fffffffffffff850,
                      (write_int_to_stream<unsigned_long_long> *)in_stack_fffffffffffff848);
  std::operator<<(poVar3," ");
  local_318 = (unsigned_long_long)
              cppcms::impl::cint<unsigned_long_long>((unsigned_long_long)in_stack_fffffffffffff848);
  poVar3 = cppcms::impl::details::operator<<
                     ((ostream *)in_stack_fffffffffffff850,
                      (write_int_to_stream<unsigned_long_long> *)in_stack_fffffffffffff848);
  std::operator<<(poVar3," ");
  local_320 = (unsigned_long_long)
              cppcms::impl::cint<unsigned_long_long>((unsigned_long_long)in_stack_fffffffffffff848);
  poVar3 = cppcms::impl::details::operator<<
                     ((ostream *)in_stack_fffffffffffff850,
                      (write_int_to_stream<unsigned_long_long> *)in_stack_fffffffffffff848);
  std::operator<<(poVar3," ");
  local_328 = (unsigned_long_long)
              cppcms::impl::cint<unsigned_long_long>((unsigned_long_long)in_stack_fffffffffffff848);
  poVar3 = cppcms::impl::details::operator<<
                     ((ostream *)in_stack_fffffffffffff850,
                      (write_int_to_stream<unsigned_long_long> *)in_stack_fffffffffffff848);
  std::operator<<(poVar3," ");
  local_330 = (unsigned_long_long)
              cppcms::impl::cint<unsigned_long_long>((unsigned_long_long)in_stack_fffffffffffff848);
  poVar3 = cppcms::impl::details::operator<<
                     ((ostream *)in_stack_fffffffffffff850,
                      (write_int_to_stream<unsigned_long_long> *)in_stack_fffffffffffff848);
  std::operator<<(poVar3," ");
  local_338 = (unsigned_long_long)
              cppcms::impl::cint<unsigned_long_long>((unsigned_long_long)in_stack_fffffffffffff848);
  poVar3 = cppcms::impl::details::operator<<
                     ((ostream *)in_stack_fffffffffffff850,
                      (write_int_to_stream<unsigned_long_long> *)in_stack_fffffffffffff848);
  std::operator<<(poVar3," ");
  local_340 = (unsigned_long_long)
              cppcms::impl::cint<unsigned_long_long>((unsigned_long_long)in_stack_fffffffffffff848);
  poVar3 = cppcms::impl::details::operator<<
                     ((ostream *)in_stack_fffffffffffff850,
                      (write_int_to_stream<unsigned_long_long> *)in_stack_fffffffffffff848);
  std::operator<<(poVar3," ");
  local_348 = (unsigned_long_long)
              cppcms::impl::cint<unsigned_long_long>((unsigned_long_long)in_stack_fffffffffffff848);
  poVar3 = cppcms::impl::details::operator<<
                     ((ostream *)in_stack_fffffffffffff850,
                      (write_int_to_stream<unsigned_long_long> *)in_stack_fffffffffffff848);
  std::operator<<(poVar3," ");
  uVar4 = std::numeric_limits<unsigned_long_long>::min();
  poVar3 = (ostream *)std::ostream::operator<<(local_2f0,uVar4);
  poVar3 = std::operator<<(poVar3," ");
  uVar4 = std::numeric_limits<unsigned_long_long>::max();
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,uVar4);
  poVar3 = std::operator<<(poVar3," ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,1);
  poVar3 = std::operator<<(poVar3," ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,0);
  poVar3 = std::operator<<(poVar3," ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,0xffffffffffffffff);
  poVar3 = std::operator<<(poVar3," ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,10);
  poVar3 = std::operator<<(poVar3," ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,0xfffffffffffffff6);
  poVar3 = std::operator<<(poVar3," ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x3039);
  poVar3 = std::operator<<(poVar3," ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,0xffffffffffffcfc7);
  std::operator<<(poVar3," ");
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::str();
  bVar1 = std::operator!=(in_stack_fffffffffffff850,in_stack_fffffffffffff848);
  std::__cxx11::string::~string(local_388);
  std::__cxx11::string::~string(local_368);
  if (bVar1) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Error!!! \n   ");
    std::__cxx11::ostringstream::str();
    poVar3 = std::operator<<(poVar3,local_3a8);
    poVar3 = std::operator<<(poVar3,"\n   ");
    std::__cxx11::ostringstream::str();
    poVar3 = std::operator<<(poVar3,local_3c8);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_3c8);
    std::__cxx11::string::~string(local_3a8);
    std::__cxx11::ostringstream::str();
    std::__cxx11::ostringstream::str();
    _Var2 = std::operator==(in_stack_fffffffffffff870,in_stack_fffffffffffff868);
    std::__cxx11::string::~string(local_408);
    std::__cxx11::string::~string(local_3e8);
    if (!_Var2) {
      std::__cxx11::ostringstream::ostringstream(local_580);
      poVar3 = std::operator<<((ostream *)local_580,"Error ");
      poVar3 = std::operator<<(poVar3,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/todec_test.cpp"
                              );
      poVar3 = std::operator<<(poVar3,":");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x20);
      std::operator<<(poVar3," a.str() == b.str()");
      local_5a1 = 1;
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      std::runtime_error::runtime_error(this,local_5a0);
      local_5a1 = 0;
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cout,"Ok       \n   ");
    std::__cxx11::ostringstream::str();
    poVar3 = std::operator<<(poVar3,local_5c8);
    poVar3 = std::operator<<(poVar3,"\n   ");
    std::__cxx11::ostringstream::str();
    poVar3 = std::operator<<(poVar3,local_5e8);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_5e8);
    std::__cxx11::string::~string(local_5c8);
  }
  std::__cxx11::ostringstream::~ostringstream(local_2f0);
  std::__cxx11::ostringstream::~ostringstream(local_178);
  return;
}

Assistant:

void test_single()
{
	using cppcms::impl::cint;
	std::ostringstream a,b;
	a 	<< cint(std::numeric_limits<T>::min()) << " " 
		<< cint(std::numeric_limits<T>::max()) << " " 
		<< cint(T(1)) << " "
		<< cint(T(0)) << " "
		<< cint(T(-1)) << " "
		<< cint(T(10)) << " "
		<< cint(T(-10)) << " "
		<< cint(T(12345)) << " "
		<< cint(T(-12345)) << " ";
	b	<< (std::numeric_limits<T>::min()) << " " 
		<< (std::numeric_limits<T>::max()) << " " 
		<< (T(1)) << " "
		<< (T(0)) << " "
		<< (T(-1)) << " "
		<< (T(10)) << " "
		<< (T(-10)) << " "
		<< (T(12345)) << " "
		<< (T(-12345)) << " ";
	if(a.str()!=b.str()) {
		std::cerr << "Error!!! \n   " << a.str() << "\n   " << b.str() << std::endl;
		TEST(a.str() == b.str());
	}
	else {
		std::cout << "Ok       \n   " << a.str() << "\n   " << b.str() << std::endl;
	}
}